

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  char *pcVar1;
  bool bVar2;
  string_view s;
  string_view s_00;
  
  s.size_ = 3;
  s.data_ = "nan";
  bVar2 = MatchString(this,s);
  if (bVar2) {
    pcVar1 = this->cursor_;
    if ((pcVar1 < this->buffer_end_) && (*pcVar1 == ':')) {
      this->cursor_ = pcVar1 + 1;
      s_00.size_ = 2;
      s_00.data_ = "0x";
      bVar2 = MatchString(this,s_00);
      if ((!bVar2) || (bVar2 = ReadHexNum(this), !bVar2)) goto LAB_00193703;
    }
    bVar2 = NoTrailingReservedChars(this);
    if (bVar2) {
      LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
      return __return_storage_ptr__;
    }
  }
LAB_00193703:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}